

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int uv_loop_alive(uv_loop_t *loop)

{
  int iVar1;
  uv_loop_t *loop_local;
  
  iVar1 = uv__loop_alive(loop);
  return iVar1;
}

Assistant:

int uv_loop_alive(const uv_loop_t* loop) {
  return uv__loop_alive(loop);
}